

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O1

ssize_t xar_write_data(archive_write *a,void *buff,size_t s)

{
  void *indata;
  long *plVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  _func_int_archive_md5_ctx_ptr_void_ptr_size_t **pp_Var6;
  la_int64_t lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uchar *b;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  size_t insize;
  size_t sVar14;
  size_t sVar15;
  
  pvVar2 = a->format_data;
  uVar3 = *(ulong *)((long)pvVar2 + 0x48);
  sVar14 = s;
  if (uVar3 < s) {
    sVar14 = uVar3;
  }
  if ((sVar14 == 0) || (*(long *)((long)pvVar2 + 0x40) == 0)) {
    return 0;
  }
  if (*(int *)(*(long *)((long)pvVar2 + 0x40) + 0xf8) == 0) {
    if (*(int *)((long)pvVar2 + 0xb0) == 1) {
      pp_Var6 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
      lVar12 = 0xc0;
LAB_0015f1ec:
      (**pp_Var6)((archive_md5_ctx *)(lVar12 + (long)pvVar2),buff,sVar14);
    }
    else if (*(int *)((long)pvVar2 + 0xb0) == 2) {
      pp_Var6 = &__archive_digest.md5update;
      lVar12 = 0xb8;
      goto LAB_0015f1ec;
    }
    sVar15 = sVar14;
    if (*(int *)((long)pvVar2 + 0x98) == 1) {
      pp_Var6 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
      lVar12 = 0xa8;
    }
    else {
      if (*(int *)((long)pvVar2 + 0x98) != 2) goto LAB_0015f246;
      pp_Var6 = &__archive_digest.md5update;
      lVar12 = 0xa0;
    }
  }
  else {
    *(void **)((long)pvVar2 + 200) = buff;
    *(size_t *)((long)pvVar2 + 0xd0) = sVar14;
    indata = (void *)((long)pvVar2 + 0x120);
    insize = 0;
    while( true ) {
      uVar4 = 0;
      if (*(int *)((long)pvVar2 + 0xf8) != 0) {
        uVar4 = (**(code **)((long)pvVar2 + 0x108))(a,(long)pvVar2 + 200,s < uVar3);
      }
      if (1 < uVar4) {
        return -0x1e;
      }
      if (s < uVar3 && *(long *)((long)pvVar2 + 0xe8) != 0) break;
      insize = 0x10000 - *(long *)((long)pvVar2 + 0xe8);
      if (*(int *)((long)pvVar2 + 0x98) == 2) {
        __archive_md5update((archive_md5_ctx *)((long)pvVar2 + 0xa0),indata,insize);
      }
      else if (*(int *)((long)pvVar2 + 0x98) == 1) {
        __archive_sha1update((archive_sha1_ctx *)((long)pvVar2 + 0xa8),indata,insize);
      }
      plVar1 = (long *)(*(long *)((long)pvVar2 + 0x40) + 0xe8);
      *plVar1 = *plVar1 + insize;
      iVar5 = write_to_temp(a,indata,insize);
      if (iVar5 != 0) {
        return -0x1e;
      }
      if (uVar4 != 0) break;
      *(void **)((long)pvVar2 + 0xe0) = indata;
      *(undefined8 *)((long)pvVar2 + 0xe8) = 0x10000;
    }
    sVar15 = sVar14 - *(long *)((long)pvVar2 + 0xd0);
    sVar14 = insize;
    if (*(int *)((long)pvVar2 + 0xb0) == 1) {
      pp_Var6 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
      lVar12 = 0xc0;
    }
    else {
      if (*(int *)((long)pvVar2 + 0xb0) != 2) goto LAB_0015f246;
      pp_Var6 = &__archive_digest.md5update;
      lVar12 = 0xb8;
    }
  }
  (**pp_Var6)((archive_md5_ctx *)(lVar12 + (long)pvVar2),buff,sVar15);
LAB_0015f246:
  lVar12 = *(long *)((long)pvVar2 + 0x48);
  lVar7 = archive_entry_size(*(archive_entry **)(*(long *)((long)pvVar2 + 0x40) + 0x20));
  if (lVar12 == lVar7) {
    lVar12 = *(long *)((long)pvVar2 + 0x40);
    *(undefined8 *)(lVar12 + 0x158) = 0;
    if (((2 < sVar15) && (*buff == '#')) && (*(char *)((long)buff + 1) == '!')) {
      uVar8 = (ulong)(*(char *)((long)buff + 2) == ' ');
      uVar3 = uVar8 + 2;
      uVar13 = sVar15 - uVar3;
      uVar8 = uVar8 | 0x1002;
      if (uVar13 < 0x1001) {
        uVar8 = sVar15;
      }
      uVar10 = uVar3;
      if (uVar3 < uVar8) {
        uVar9 = uVar3;
        uVar11 = 0x1000;
        if (uVar13 < 0x1000) {
          uVar11 = uVar13;
        }
        do {
          if (((ulong)*(byte *)((long)buff + uVar9) < 0x21) &&
             (uVar10 = uVar9,
             (0x100002601U >> ((ulong)*(byte *)((long)buff + uVar9) & 0x3f) & 1) != 0)) break;
          uVar11 = uVar11 - 1;
          uVar10 = uVar8;
          uVar9 = uVar9 + 1;
        } while (uVar11 != 0);
      }
      *(undefined8 *)(lVar12 + 0x158) = 0;
      archive_strncat((archive_string *)(lVar12 + 0x150),(void *)(uVar3 + (long)buff),uVar10 - uVar3
                     );
    }
  }
  if (*(int *)(*(long *)((long)pvVar2 + 0x40) + 0xf8) == 0) {
    iVar5 = write_to_temp(a,buff,sVar14);
    if (iVar5 != 0) {
      return -0x1e;
    }
    plVar1 = (long *)(*(long *)((long)pvVar2 + 0x40) + 0xe8);
    *plVar1 = *plVar1 + sVar14;
  }
  *(long *)((long)pvVar2 + 0x48) = *(long *)((long)pvVar2 + 0x48) - sVar15;
  return sVar15;
}

Assistant:

static ssize_t
xar_write_data(struct archive_write *a, const void *buff, size_t s)
{
	struct xar *xar;
	enum la_zaction run;
	size_t size = 0;
	size_t rsize;
	int r;

	xar = (struct xar *)a->format_data;

	if (s > xar->bytes_remaining)
		s = (size_t)xar->bytes_remaining;
	if (s == 0 || xar->cur_file == NULL)
		return (0);
	if (xar->cur_file->data.compression == NONE) {
		checksum_update(&(xar->e_sumwrk), buff, s);
		checksum_update(&(xar->a_sumwrk), buff, s);
		size = rsize = s;
	} else {
		xar->stream.next_in = (const unsigned char *)buff;
		xar->stream.avail_in = s;
		if (xar->bytes_remaining > s)
			run = ARCHIVE_Z_RUN;
		else
			run = ARCHIVE_Z_FINISH;
		/* Compress file data. */
		for (;;) {
			r = compression_code(&(a->archive), &(xar->stream),
			    run);
			if (r != ARCHIVE_OK && r != ARCHIVE_EOF)
				return (ARCHIVE_FATAL);
			if (xar->stream.avail_out == 0 ||
			    run == ARCHIVE_Z_FINISH) {
				size = sizeof(xar->wbuff) -
				    xar->stream.avail_out;
				checksum_update(&(xar->a_sumwrk), xar->wbuff,
				    size);
				xar->cur_file->data.length += size;
				if (write_to_temp(a, xar->wbuff,
				    size) != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
				if (r == ARCHIVE_OK) {
					/* Output buffer was full */
					xar->stream.next_out = xar->wbuff;
					xar->stream.avail_out =
					    sizeof(xar->wbuff);
				} else {
					/* ARCHIVE_EOF - We are done */
					break;
				}
			} else {
				/* Compressor wants more input */
				break;
			}
		}
		rsize = s - xar->stream.avail_in;
		checksum_update(&(xar->e_sumwrk), buff, rsize);
	}
#if !defined(_WIN32) || defined(__CYGWIN__)
	if (xar->bytes_remaining ==
	    (uint64_t)archive_entry_size(xar->cur_file->entry)) {
		/*
		 * Get the path of a shell script if so.
		 */
		const unsigned char *b = (const unsigned char *)buff;

		archive_string_empty(&(xar->cur_file->script));
		if (rsize > 2 && b[0] == '#' && b[1] == '!') {
			size_t i, end, off;

			off = 2;
			if (b[off] == ' ')
				off++;
#ifdef PATH_MAX
			if ((rsize - off) > PATH_MAX)
				end = off + PATH_MAX;
			else
#endif
				end = rsize;
			/* Find the end of a script path. */
			for (i = off; i < end && b[i] != '\0' &&
			    b[i] != '\n' && b[i] != '\r' &&
			    b[i] != ' ' && b[i] != '\t'; i++)
				;
			archive_strncpy(&(xar->cur_file->script), b + off,
			    i - off);
		}
	}
#endif

	if (xar->cur_file->data.compression == NONE) {
		if (write_to_temp(a, buff, size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		xar->cur_file->data.length += size;
	}
	xar->bytes_remaining -= rsize;

	return (rsize);
}